

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_nearby_dic_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  char **d_1;
  char parent [260];
  char **d;
  char temp [260];
  Open_JTalk *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char **path_00;
  char local_238 [264];
  char **local_130;
  char *in_stack_fffffffffffffed8;
  
  if (((in_RDI != 0) && (in_RSI != (char *)0x0)) && (sVar2 = strlen(in_RSI), sVar2 != 0)) {
    clear_path_string(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
    for (local_130 = G_DEFAULT_DIC_DIR_NAMES; *local_130 != (char *)0x0; local_130 = local_130 + 1)
    {
      _Var1 = search_directory(in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                               (char *)0x193099);
      if (_Var1) goto LAB_00193135;
    }
    get_dir_path(in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8);
    sVar2 = strlen(local_238);
    if (sVar2 != 0) {
      for (path_00 = G_DEFAULT_DIC_DIR_NAMES; *path_00 != (char *)0x0; path_00 = path_00 + 1) {
        _Var1 = search_directory((char *)path_00,(char *)in_stack_fffffffffffffdb8,(char *)0x19310f)
        ;
        if (_Var1) {
LAB_00193135:
          _Var1 = check_dic_utf_8(in_stack_fffffffffffffed8);
          if (_Var1) {
            strcpy((char *)(in_RDI + 8),&stack0xfffffffffffffed8);
            Open_JTalk_load_dic(in_stack_fffffffffffffdb8,(char *)0x193181);
            return true;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool set_nearby_dic_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 指定位置から可能性のある名前を探す
	for (const char **d = G_DEFAULT_DIC_DIR_NAMES; *d != NULL; d++)
	{
		if (search_directory(path, *d, temp))
		{
			goto check_charset;
		}
	}

	// その親ディレクトリから可能性のあるフォルダを探す
	char parent[MAX_PATH];
	get_dir_path(path, parent);
	if (parent != NULL && strlen(parent) != 0)
	{
		for (const char **d = G_DEFAULT_DIC_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(parent, *d, temp))
			{
				goto check_charset;
			}
		}
	}
	return false;

check_charset:
	if (!check_dic_utf_8(temp))
	{
		return false;
	}
	strcpy(oj->dn_dic_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, temp);
#endif

	return true;
}